

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::BufferMemoryBarrier
          (DeviceContextVkImpl *this,IBuffer *pBuffer,VkAccessFlags NewAccessFlags)

{
  RESOURCE_STATE NewState;
  char (*in_RCX) [19];
  char (*in_R8) [38];
  string msg;
  string local_40;
  
  if (pBuffer == (IBuffer *)0x0) {
    FormatString<char[26],char[19]>
              (&local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x6d8d13,in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"BufferMemoryBarrier",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xc2f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  }
  if (*(int *)&pBuffer[0xb].super_IDeviceObject.super_IObject._vptr_IObject == 0) {
    FormatString<char[53],char_const*,char[38]>
              (&local_40,(Diligent *)"Failed to execute buffer memory barrier for buffer \'",
               (char (*) [53])(pBuffer + 3),(char **)"\' because the buffer state is unknown",in_R8)
    ;
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_40._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    NewState = VkAccessFlagsToResourceStates(NewAccessFlags);
    if ((NewState & ~*(uint *)&pBuffer[0xb].super_IDeviceObject.super_IObject._vptr_IObject) !=
        RESOURCE_STATE_UNKNOWN) {
      TransitionBufferState(this,(BufferVkImpl *)pBuffer,RESOURCE_STATE_UNKNOWN,NewState,true);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BufferMemoryBarrier(IBuffer* pBuffer, VkAccessFlags NewAccessFlags)
{
    VERIFY_EXPR(pBuffer != nullptr);
    BufferVkImpl* pBuffVk = ClassPtrCast<BufferVkImpl>(pBuffer);
    if (!pBuffVk->IsInKnownState())
    {
        LOG_ERROR_MESSAGE("Failed to execute buffer memory barrier for buffer '", pBuffVk->GetDesc().Name, "' because the buffer state is unknown");
        return;
    }
    RESOURCE_STATE NewState = VkAccessFlagsToResourceStates(NewAccessFlags);
    if ((pBuffVk->GetState() & NewState) != NewState)
    {
        TransitionBufferState(*pBuffVk, RESOURCE_STATE_UNKNOWN, NewState, true);
    }
}